

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_DC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  int iVar3;
  boolean bVar4;
  jpeg_source_mgr *pjVar5;
  int bits_left;
  uint uVar6;
  ulong uVar7;
  _func_void_j_decompress_ptr *get_buffer;
  long lVar8;
  bitread_working_state br_state;
  bitread_working_state local_58;
  
  iVar3 = cinfo->Al;
  pjVar1 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar1[3].decode_mcu != 0)) ||
     (bVar4 = process_restart(cinfo), bVar4 != 0)) {
    pjVar5 = cinfo->src;
    local_58.next_input_byte = pjVar5->next_input_byte;
    local_58.bytes_in_buffer = pjVar5->bytes_in_buffer;
    get_buffer = pjVar1[1].start_pass;
    uVar6 = *(uint *)&pjVar1[1].decode_mcu;
    uVar7 = (ulong)uVar6;
    if (0 < cinfo->blocks_in_MCU) {
      lVar8 = 0;
      local_58.cinfo = cinfo;
      do {
        paJVar2 = MCU_data[lVar8];
        bits_left = (int)uVar7;
        if ((bits_left < 1) &&
           (bVar4 = jpeg_fill_bit_buffer(&local_58,(bit_buf_type)get_buffer,bits_left,1),
           get_buffer = (_func_void_j_decompress_ptr *)local_58.get_buffer,
           bits_left = local_58.bits_left, bVar4 == 0)) goto LAB_0027fe51;
        uVar6 = bits_left - 1;
        uVar7 = (ulong)uVar6;
        if (((ulong)get_buffer >> (uVar7 & 0x3f) & 1) != 0) {
          (*paJVar2)[0] = (*paJVar2)[0] | (ushort)(1 << ((byte)iVar3 & 0x1f));
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < cinfo->blocks_in_MCU);
      pjVar5 = cinfo->src;
    }
    pjVar5->next_input_byte = local_58.next_input_byte;
    pjVar5->bytes_in_buffer = local_58.bytes_in_buffer;
    pjVar1[1].start_pass = get_buffer;
    *(uint *)&pjVar1[1].decode_mcu = uVar6;
    *(int *)&pjVar1[3].decode_mcu = *(int *)&pjVar1[3].decode_mcu + -1;
    bVar4 = 1;
  }
  else {
LAB_0027fe51:
    bVar4 = 0;
  }
  return bVar4;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  unsigned char *st;
  int p1, blkn;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;	/* use fixed probability estimation */
  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* Encoded data is simply the next bit of the two's-complement DC value */
    if (arith_decode(cinfo, st))
      MCU_data[blkn][0][0] |= p1;
  }

  return TRUE;
}